

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O2

wchar_t context_menu_command(wchar_t mx,wchar_t my)

{
  int iVar1;
  uint uVar2;
  menu *pmVar3;
  wchar_t wVar4;
  cmd_info_conflict *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte local_9f;
  byte local_9e;
  undefined1 local_9d;
  uint local_9c;
  wchar_t local_98;
  wchar_t local_94;
  cmd_info_conflict *local_90;
  char cmd_name [80];
  
  pmVar3 = menu_dynamic_new();
  if (pmVar3 == (menu *)0x0) {
    wVar4 = L'\0';
  }
  else {
    pmVar3->selections = "abcdefghijklmnopqrstuvwxyz";
    menu_dynamic_add(pmVar3,"Item",1);
    menu_dynamic_add(pmVar3,"Action",2);
    menu_dynamic_add(pmVar3,"Item Management",3);
    menu_dynamic_add(pmVar3,"Info",4);
    menu_dynamic_add(pmVar3,"Util",5);
    menu_dynamic_add(pmVar3,"Misc",6);
    local_94 = mx;
    menu_dynamic_calc_location(pmVar3,mx,my);
    screen_save();
    region_erase_bordered((region_conflict *)&pmVar3->boundary);
    wVar4 = L'\0';
    prt("(Enter to select, ESC) Command:",L'\0',L'\0');
    iVar1 = menu_dynamic_select(pmVar3);
    menu_dynamic_free(pmVar3);
    screen_load();
    if (0 < iVar1) {
      local_90 = cmds_all[iVar1 - 1U].list;
      uVar2 = (uint)cmds_all[iVar1 - 1U].len;
      uVar6 = (ulong)(player->opts).opt[1];
      local_98 = my;
      pmVar3 = menu_dynamic_new();
      if (pmVar3 != (menu *)0x0) {
        pmVar3->selections = "abcdefghijklmnopqrstuvwxyz";
        local_9d = 0;
        uVar7 = 0;
        if (0 < (int)uVar2) {
          uVar7 = (ulong)uVar2;
        }
        uVar8 = 0;
        pcVar5 = local_90;
        local_9c = uVar2;
        while (uVar7 != uVar8) {
          uVar2 = pcVar5->key[uVar6];
          local_9f = (byte)uVar2;
          local_9e = (0xffffffe4 < uVar2 - 0x1c) << 5 | local_9f | 0x40;
          if (uVar2 < 0x20) {
            local_9f = 0x5e;
          }
          else {
            local_9e = 0;
          }
          strnfmt(cmd_name,0x50,"%s (%s)",pcVar5->desc,&local_9f);
          uVar8 = uVar8 + 1;
          menu_dynamic_add(pmVar3,cmd_name,(int)uVar8);
          pcVar5 = pcVar5 + 1;
        }
        menu_dynamic_calc_location(pmVar3,local_94,local_98);
        screen_save();
        region_erase_bordered((region_conflict *)&pmVar3->boundary);
        prt("(Enter to select, ESC) Command:",L'\0',L'\0');
        uVar2 = menu_dynamic_select(pmVar3);
        menu_dynamic_free(pmVar3);
        screen_load();
        if ((0 < (int)uVar2) && ((int)uVar2 <= (int)local_9c)) {
          Term_keypress(local_90[uVar2].key[uVar6 - 0x14],'\0');
        }
      }
      wVar4 = L'\x01';
    }
  }
  return wVar4;
}

Assistant:

int context_menu_command(int mx, int my)
{
	struct menu *m;
	int selected;

	m = menu_dynamic_new();
	if (!m) {
		return 0;
	}

	m->selections = lower_case;
	menu_dynamic_add(m, "Item", 1);
	menu_dynamic_add(m, "Action", 2);
	menu_dynamic_add(m, "Item Management", 3);
	menu_dynamic_add(m, "Info", 4);
	menu_dynamic_add(m, "Util", 5);
	menu_dynamic_add(m, "Misc", 6);

	menu_dynamic_calc_location(m, mx, my);

	screen_save();
	region_erase_bordered(&m->boundary);

	prt("(Enter to select, ESC) Command:", 0, 0);
	selected = menu_dynamic_select(m);
	menu_dynamic_free(m);

	screen_load();

	/* XXX-AS this is gross, as is the way there's two ways to display the
	 * entire command list.  Fix me */
	if (selected > 0) {
		selected--;
		show_command_list(cmds_all[selected].list, cmds_all[selected].len,
						  mx, my);
	} else {
		return 0;
	}

	return 1;
}